

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O3

SUNMatrix SUNSparseFromDenseMatrix(SUNMatrix Ad,realtype droptol,int sparsetype)

{
  double dVar1;
  long *plVar2;
  long M;
  long N;
  void *pvVar3;
  long lVar4;
  SUNMatrix_ID SVar5;
  SUNMatrix p_Var6;
  long lVar7;
  sunindextype NNZ;
  long lVar8;
  long lVar9;
  long lVar10;
  
  if (droptol < 0.0 || 1 < (uint)sparsetype) {
    return (SUNMatrix)0x0;
  }
  SVar5 = SUNMatGetID(Ad);
  if (SVar5 == SUNMATRIX_DENSE) {
    plVar2 = (long *)Ad->content;
    M = *plVar2;
    N = plVar2[1];
    if (N < 1) {
      NNZ = 0;
    }
    else {
      lVar7 = 0;
      NNZ = 0;
      do {
        if (0 < M) {
          lVar8 = 0;
          do {
            NNZ = NNZ + (ulong)(droptol <
                               ABS(*(double *)(*(long *)(plVar2[4] + lVar7 * 8) + lVar8 * 8)));
            lVar8 = lVar8 + 1;
          } while (M != lVar8);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != N);
    }
    p_Var6 = SUNSparseMatrix(M,N,NNZ,sparsetype);
    if (p_Var6 != (SUNMatrix)0x0) {
      if (sparsetype != 0) {
        pvVar3 = p_Var6->content;
        lVar7 = *(long *)((long)pvVar3 + 0x38);
        if (M < 1) {
          lVar8 = 0;
        }
        else {
          lVar9 = 0;
          lVar8 = 0;
          do {
            *(long *)(lVar7 + lVar9 * 8) = lVar8;
            if (0 < N) {
              lVar4 = *(long *)((long)Ad->content + 0x20);
              lVar10 = 0;
              do {
                dVar1 = *(double *)(*(long *)(lVar4 + lVar10 * 8) + lVar9 * 8);
                if (droptol < ABS(dVar1)) {
                  *(long *)(*(long *)((long)pvVar3 + 0x30) + lVar8 * 8) = lVar10;
                  *(double *)(*(long *)((long)pvVar3 + 0x20) + lVar8 * 8) = dVar1;
                  lVar8 = lVar8 + 1;
                }
                lVar10 = lVar10 + 1;
              } while (N != lVar10);
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 != M);
        }
        *(long *)(lVar7 + M * 8) = lVar8;
        return p_Var6;
      }
      pvVar3 = p_Var6->content;
      lVar7 = *(long *)((long)pvVar3 + 0x38);
      if (N < 1) {
        lVar8 = 0;
      }
      else {
        lVar9 = 0;
        lVar8 = 0;
        do {
          *(long *)(lVar7 + lVar9 * 8) = lVar8;
          if (0 < M) {
            lVar4 = *(long *)(*(long *)((long)Ad->content + 0x20) + lVar9 * 8);
            lVar10 = 0;
            do {
              dVar1 = *(double *)(lVar4 + lVar10 * 8);
              if (droptol < ABS(dVar1)) {
                *(long *)(*(long *)((long)pvVar3 + 0x30) + lVar8 * 8) = lVar10;
                *(double *)(*(long *)((long)pvVar3 + 0x20) + lVar8 * 8) = dVar1;
                lVar8 = lVar8 + 1;
              }
              lVar10 = lVar10 + 1;
            } while (M != lVar10);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != N);
      }
      *(long *)(lVar7 + N * 8) = lVar8;
      return p_Var6;
    }
  }
  return (SUNMatrix)0x0;
}

Assistant:

SUNMatrix SUNSparseFromDenseMatrix(SUNMatrix Ad, realtype droptol, int sparsetype)
{
  sunindextype i, j, nnz;
  sunindextype M, N;
  SUNMatrix As;

  /* check for legal sparsetype, droptol and input matrix type */
  if ( (sparsetype != CSR_MAT) && (sparsetype != CSC_MAT) )
    return NULL;
  if ( droptol < ZERO )
    return NULL;
  if (SUNMatGetID(Ad) != SUNMATRIX_DENSE)
    return NULL;
  
  /* set size of new matrix */
  M = SM_ROWS_D(Ad);
  N = SM_COLUMNS_D(Ad);

  /* determine total number of nonzeros */
  nnz = 0;
  for (j=0; j<N; j++)
    for (i=0; i<M; i++)
      nnz += (SUNRabs(SM_ELEMENT_D(Ad,i,j)) > droptol);
    
  /* allocate sparse matrix */
  As = SUNSparseMatrix(M, N, nnz, sparsetype);
  if (As == NULL)  return NULL;
  
  /* copy nonzeros from Ad into As, based on CSR/CSC type */
  nnz = 0;
  if (sparsetype == CSC_MAT) {
    for (j=0; j<N; j++) {
      (SM_INDEXPTRS_S(As))[j] = nnz;
      for (i=0; i<M; i++) {
        if ( SUNRabs(SM_ELEMENT_D(Ad,i,j)) > droptol ) { 
          (SM_INDEXVALS_S(As))[nnz] = i;
          (SM_DATA_S(As))[nnz++] = SM_ELEMENT_D(Ad,i,j);
        }
      }
    }
    (SM_INDEXPTRS_S(As))[N] = nnz;
  } else {       /* CSR_MAT */
    for (i=0; i<M; i++) {
      (SM_INDEXPTRS_S(As))[i] = nnz;
      for (j=0; j<N; j++) {
        if ( SUNRabs(SM_ELEMENT_D(Ad,i,j)) > droptol ) { 
          (SM_INDEXVALS_S(As))[nnz] = j;
          (SM_DATA_S(As))[nnz++] = SM_ELEMENT_D(Ad,i,j);
        }
      }
    }
    (SM_INDEXPTRS_S(As))[M] = nnz;
  }
    
  return(As);
}